

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_function_definition(FILE *out,Denoted_Function *function)

{
  Denoted_Function *function_local;
  FILE *out_local;
  
  print_token(out,function->id);
  fprintf((FILE *)out," is");
  if (function->linkage == LINKAGE_EXTERNAL) {
    fprintf((FILE *)out," an externally linked ");
  }
  else {
    if (function->linkage != LINKAGE_INTERNAL) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/backend/print/print.c"
                    ,0x2cc,"void print_function_definition(FILE *, struct Denoted_Function *)");
    }
    fprintf((FILE *)out," an internally linked ");
  }
  print_type(out,function->type,'\x01');
  print_ast(out,(AST *)function->body);
  return;
}

Assistant:

void print_function_definition(FILE *out,struct Denoted_Function *function)
{
	print_token(out,function->id);
	fprintf(out," is");
	switch(function->linkage)
	{
		case LINKAGE_EXTERNAL:
			fprintf(out," an externally linked ");
			break;
		case LINKAGE_INTERNAL:
			fprintf(out," an internally linked ");
			break;
		default:
			assert(0);
	}
	print_type(out,function->type,1);
	print_ast(out,(struct AST*)function->body);
}